

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_ptr_field.h
# Opt level: O0

Value<google::protobuf::internal::GenericTypeHandler<std::string>_> * __thiscall
google::protobuf::internal::RepeatedPtrFieldBase::
Mutable<google::protobuf::internal::GenericTypeHandler<std::__cxx11::string>>
          (RepeatedPtrFieldBase *this,int index)

{
  int iVar1;
  int iVar2;
  LogMessage *pLVar3;
  void **ppvVar4;
  Value<google::protobuf::internal::GenericTypeHandler<std::string>_> *pVVar5;
  undefined1 auVar6 [16];
  LogMessageFatal local_68 [23];
  Voidify local_51;
  string *local_50;
  string *absl_log_internal_check_op_result_1;
  undefined8 local_40;
  LogMessageFatal local_38 [23];
  Voidify local_21;
  string *local_20;
  string *absl_log_internal_check_op_result;
  RepeatedPtrFieldBase *pRStack_10;
  int index_local;
  RepeatedPtrFieldBase *this_local;
  
  absl_log_internal_check_op_result._4_4_ = index;
  pRStack_10 = this;
  iVar1 = absl::lts_20240722::log_internal::GetReferenceableValue(index);
  iVar2 = absl::lts_20240722::log_internal::GetReferenceableValue(0);
  local_20 = absl::lts_20240722::log_internal::Check_GEImpl_abi_cxx11_(iVar1,iVar2,"index >= 0");
  if (local_20 != (string *)0x0) {
    auVar6 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_20);
    local_40 = auVar6._8_8_;
    absl_log_internal_check_op_result_1 = auVar6._0_8_;
    absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
              (local_38,
               "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O0/_deps/protobuf-src/src/google/protobuf/repeated_ptr_field.h"
               ,0xbc,absl_log_internal_check_op_result_1,local_40);
    pLVar3 = absl::lts_20240722::log_internal::LogMessage::InternalStream((LogMessage *)local_38);
    absl::lts_20240722::log_internal::Voidify::operator&&(&local_21,pLVar3);
    absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal(local_38);
  }
  iVar1 = absl::lts_20240722::log_internal::GetReferenceableValue
                    (absl_log_internal_check_op_result._4_4_);
  iVar2 = absl::lts_20240722::log_internal::GetReferenceableValue(this->current_size_);
  local_50 = absl::lts_20240722::log_internal::Check_LTImpl_abi_cxx11_
                       (iVar1,iVar2,"index < current_size_");
  if (local_50 != (string *)0x0) {
    auVar6 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_50);
    absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
              (local_68,
               "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O0/_deps/protobuf-src/src/google/protobuf/repeated_ptr_field.h"
               ,0xbd,auVar6._0_8_,auVar6._8_8_);
    pLVar3 = absl::lts_20240722::log_internal::LogMessage::InternalStream((LogMessage *)local_68);
    absl::lts_20240722::log_internal::Voidify::operator&&(&local_51,pLVar3);
    absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal(local_68);
  }
  ppvVar4 = element_at(this,absl_log_internal_check_op_result._4_4_);
  pVVar5 = cast<google::protobuf::internal::GenericTypeHandler<std::__cxx11::string>>(*ppvVar4);
  return pVVar5;
}

Assistant:

Value<TypeHandler>* Mutable(int index) {
    ABSL_DCHECK_GE(index, 0);
    ABSL_DCHECK_LT(index, current_size_);
    return cast<TypeHandler>(element_at(index));
  }